

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cptr_el2_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  if ((env->features & 0x210000000) == 0x200000000) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_0061bdd2;
    }
    else if ((~env->pstate & 0xc) == 0) goto LAB_0061bdd2;
    if ((((env->cp15).scr_el3 & 1) != 0) && (((env->cp15).nsacr & 0x400) == 0)) {
      value = value & 0xfffffffffffff3ff | (ulong)((uint)(env->cp15).cptr_el[2] & 0xc00);
    }
  }
LAB_0061bdd2:
  (env->cp15).cptr_el[2] = value;
  return;
}

Assistant:

static void cptr_el2_write(CPUARMState *env, const ARMCPRegInfo *ri,
                           uint64_t value)
{
    /*
     * For A-profile AArch32 EL3, if NSACR.CP10
     * is 0 then HCPTR.{TCP11,TCP10} ignore writes and read as 1.
     */
    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0x3 << 10);
        value |= env->cp15.cptr_el[2] & (0x3 << 10);
    }
    env->cp15.cptr_el[2] = value;
}